

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_64bit_generated.h
# Opt level: O3

bool __thiscall WrapperTable::Verify(WrapperTable *this,Verifier *verifier)

{
  bool bVar1;
  ulong uVar2;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((!bVar1) ||
     (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>(&this->super_Table,verifier,4), !bVar1
     )) {
    return false;
  }
  if ((4 < *(ushort *)(this + -(long)*(int *)this)) &&
     ((uVar2 = (ulong)*(ushort *)(this + (4 - (long)*(int *)this)), uVar2 != 0 &&
      (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                         (verifier,(uint8_t *)(this + *(long *)(this + uVar2) + uVar2),1,
                          (size_t *)0x0), !bVar1)))) {
    return false;
  }
  verifier->depth_ = verifier->depth_ - 1;
  return true;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffset64(verifier, VT_VECTOR) &&
           verifier.VerifyVector(vector()) &&
           verifier.EndTable();
  }